

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::compose
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool onlyContiguous,UBool doCompose,
          ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  ushort *puVar1;
  UChar UVar2;
  UChar UVar3;
  ushort norm16;
  UChar UVar4;
  ushort norm16_00;
  void *pvVar5;
  UBool UVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  UChar *src_00;
  UChar *pUVar10;
  short sVar11;
  ReorderingBuffer *buffer_00;
  uint c;
  ReorderingBuffer *pRVar12;
  UChar *pUVar13;
  UChar *pUVar14;
  UCPTrie *pUVar15;
  ushort uVar16;
  
  UVar2 = this->minCompNoMaybeCP;
  src_00 = src;
  if (limit == (UChar *)0x0) {
    pRVar12 = (ReorderingBuffer *)0x0;
    buffer_00 = buffer;
    if (doCompose == '\0') {
      buffer_00 = pRVar12;
    }
    pUVar10 = copyLowPrefixFromNulTerminated(this,src,(uint)(ushort)UVar2,buffer_00,errorCode);
    if (U_ZERO_ERROR < *errorCode) goto LAB_00179d73;
    limit = u_strchr_63(pUVar10,L'\0');
    src_00 = pUVar10;
    if ((pUVar10 != src) &&
       (UVar6 = hasCompBoundaryAfter(this,(uint)(ushort)pUVar10[-1],onlyContiguous), src = pUVar10,
       UVar6 == '\0')) {
      ReorderingBuffer::removeSuffix(buffer,1);
      src_00 = pUVar10 + -1;
      src = pUVar10 + -1;
    }
  }
LAB_00179590:
  pUVar14 = src;
  pUVar10 = src_00;
  if (pUVar10 == limit) {
    pRVar12 = (ReorderingBuffer *)0x1;
    if ((doCompose != '\0') && (pUVar14 != limit)) {
LAB_00179d3f:
      pRVar12 = (ReorderingBuffer *)0x1;
      ReorderingBuffer::appendZeroCC(buffer,pUVar14,limit,errorCode);
    }
    goto LAB_00179d73;
  }
  UVar3 = *pUVar10;
  c = (uint)(ushort)UVar3;
  src = pUVar14;
  if ((ushort)UVar3 < (ushort)UVar2) {
LAB_001795d0:
    src_00 = pUVar10 + 1;
    goto LAB_00179590;
  }
  pUVar15 = this->normTrie;
  pvVar5 = (pUVar15->data).ptr0;
  norm16 = *(ushort *)
            ((long)pvVar5 +
            (ulong)(((ushort)UVar3 & 0x3f) + (uint)pUVar15->index[(ushort)UVar3 >> 6]) * 2);
  uVar16 = this->minNoNo;
  if (norm16 < uVar16) goto LAB_001795d0;
  src_00 = pUVar10 + 1;
  if (((ushort)UVar3 & 0xfc00) == 0xd800) {
    if ((src_00 == limit) || (((ushort)*src_00 & 0xfc00) != 0xdc00)) goto LAB_00179590;
    c = (uint)(ushort)UVar3 * 0x400 + (uint)(ushort)*src_00 + 0xfca02400;
    if ((int)c < pUVar15->highStart) {
      iVar9 = ucptrie_internalSmallIndex_63(pUVar15,c);
      uVar16 = this->minNoNo;
    }
    else {
      iVar9 = pUVar15->dataLength + -2;
    }
    src_00 = pUVar10 + 2;
    norm16 = *(ushort *)((long)pvVar5 + (long)iVar9 * 2);
    if (norm16 < uVar16) goto LAB_00179590;
  }
  if (this->minMaybeYes <= norm16) {
    if ((norm16 == 0xfe00) && (pUVar14 != pUVar10)) {
      pUVar13 = pUVar10 + -1;
      UVar3 = pUVar10[-1];
      if (c < 0x11a7) {
        if (0x12 < (ushort)(UVar3 + L'\xef00')) goto LAB_001798f4;
        if (doCompose == '\0') goto LAB_00179df4;
        if ((src_00 == limit) || (0x1a < (ushort)(*src_00 + L'\xee58'))) {
          UVar6 = hasCompBoundaryBefore(this,src_00,limit);
          sVar11 = 0;
          if (UVar6 == '\0') goto LAB_001798f4;
        }
        else {
          sVar11 = *src_00 + L'\xee59';
          src_00 = src_00 + 1;
        }
        if ((pUVar14 != pUVar13) &&
           (UVar6 = ReorderingBuffer::appendZeroCC(buffer,pUVar14,pUVar13,errorCode), UVar6 == '\0')
           ) goto LAB_00179dfb;
        UVar3 = ((short)c + (UVar3 + L'\xef00') * 0x15) * 0x1c + sVar11 + L'앤';
      }
      else {
        if ((0x2ba3 < (ushort)UVar3 - 0xac00) ||
           ((ushort)((ushort)((ushort)UVar3 - 0xac00) % 0x1c) != 0)) goto LAB_001798f4;
        if (doCompose == '\0') goto LAB_00179df4;
        if ((pUVar14 != pUVar13) &&
           (UVar6 = ReorderingBuffer::appendZeroCC(buffer,pUVar14,pUVar13,errorCode), UVar6 == '\0')
           ) goto LAB_00179dfb;
        UVar3 = (short)c + UVar3 + L'\xee59';
      }
      UVar6 = ReorderingBuffer::appendBMP(buffer,UVar3,'\0',errorCode);
      pRVar12 = (ReorderingBuffer *)0x1;
      src = src_00;
      if (UVar6 == '\0') goto LAB_00179d73;
      goto LAB_00179590;
    }
    if (norm16 < 0xfe01) goto LAB_001798f4;
    uVar16 = norm16 >> 1;
    pUVar13 = src_00;
    if ((onlyContiguous == '\0') ||
       (bVar8 = getPreviousTrailCC(this,pUVar14,pUVar10), bVar8 <= (byte)uVar16)) {
      do {
        src_00 = pUVar13;
        if (src_00 == limit) {
          pRVar12 = (ReorderingBuffer *)0x1;
          if (doCompose == '\0') goto LAB_00179d73;
          goto LAB_00179d3f;
        }
        pUVar13 = src_00 + 1;
        UVar3 = *src_00;
        if ((UVar3 & 0xf800U) == 0xd800) {
          if ((((ushort)UVar3 >> 10 & 1) == 0) && (pUVar13 != limit)) {
            UVar4 = *pUVar13;
            pUVar15 = this->normTrie;
            if ((UVar4 & 0xfc00U) == 0xdc00) {
              pUVar13 = src_00 + 2;
              iVar9 = (uint)(ushort)UVar3 * 0x400 + (uint)(ushort)UVar4 + -0x35fdc00;
              if (iVar9 < pUVar15->highStart) {
                iVar9 = ucptrie_internalSmallIndex_63(pUVar15,iVar9);
                pUVar15 = this->normTrie;
              }
              else {
                iVar9 = pUVar15->dataLength + -2;
              }
              goto LAB_00179b70;
            }
          }
          else {
            pUVar15 = this->normTrie;
          }
          iVar9 = pUVar15->dataLength + -1;
        }
        else {
          pUVar15 = this->normTrie;
          iVar9 = ((ushort)UVar3 & 0x3f) + (uint)pUVar15->index[(ushort)UVar3 >> 6];
        }
LAB_00179b70:
        norm16_00 = *(ushort *)((long)(pUVar15->data).ptr0 + (long)iVar9 * 2);
        if (norm16_00 < 0xfe02) goto LAB_00179cc9;
        bVar8 = (byte)uVar16;
        uVar16 = norm16_00 >> 1;
      } while (bVar8 <= (byte)(norm16_00 >> 1));
      if (doCompose != '\0') {
LAB_00179cc9:
        UVar6 = norm16HasCompBoundaryBefore(this,norm16_00);
        if (UVar6 == '\0') goto LAB_001798f4;
        if (norm16_00 < this->minNoNo) {
          src_00 = pUVar13;
        }
        goto LAB_00179590;
      }
    }
    else if (doCompose != '\0') goto LAB_001798f4;
LAB_00179df4:
    pRVar12 = (ReorderingBuffer *)0x0;
    goto LAB_00179d73;
  }
  if (doCompose == '\0') goto LAB_00179df4;
  src = src_00;
  if (this->limitNoNo <= norm16) {
    UVar6 = norm16HasCompBoundaryAfter(this,norm16,onlyContiguous);
    if ((UVar6 == '\0') && (UVar6 = hasCompBoundaryBefore(this,src_00,limit), UVar6 == '\0'))
    goto LAB_001798f4;
    if ((pUVar14 == pUVar10) ||
       (UVar6 = ReorderingBuffer::appendZeroCC(buffer,pUVar14,pUVar10,errorCode), UVar6 != '\0')) {
      cVar7 = ReorderingBuffer::append
                        (buffer,(c + (norm16 >> 3)) - (uint)this->centerNoNoDelta,'\0',errorCode);
      goto LAB_00179864;
    }
LAB_00179dfb:
    pRVar12 = (ReorderingBuffer *)0x1;
    goto LAB_00179d73;
  }
  if (norm16 < this->minNoNoCompBoundaryBefore) {
    UVar6 = norm16HasCompBoundaryAfter(this,norm16,onlyContiguous);
    if ((UVar6 != '\0') || (UVar6 = hasCompBoundaryBefore(this,src_00,limit), UVar6 != '\0')) {
      if ((pUVar14 != pUVar10) &&
         (UVar6 = ReorderingBuffer::appendZeroCC(buffer,pUVar14,pUVar10,errorCode), UVar6 == '\0'))
      goto LAB_00179dfb;
      puVar1 = (ushort *)((long)this->extraData + (ulong)(norm16 & 0xfffe));
      cVar7 = ReorderingBuffer::appendZeroCC
                        (buffer,(UChar *)(puVar1 + 1),
                         (UChar *)((long)this->extraData +
                                  (ulong)(*puVar1 & 0x1f) * 2 + (ulong)(norm16 & 0xfffe) + 2),
                         errorCode);
      goto LAB_00179864;
    }
LAB_001798f4:
    if ((pUVar14 != pUVar10) && (UVar6 = norm16HasCompBoundaryBefore(this,norm16), UVar6 == '\0')) {
      pUVar13 = pUVar10 + -1;
      UVar3 = pUVar10[-1];
      if ((UVar3 & 0xf800U) == 0xd800) {
        if ((pUVar13 == pUVar14 || ((ushort)UVar3 >> 10 & 1) == 0) ||
           ((pUVar10[-2] & 0xfc00U) != 0xd800)) {
          pUVar15 = this->normTrie;
          iVar9 = pUVar15->dataLength + -1;
        }
        else {
          pUVar13 = pUVar10 + -2;
          iVar9 = (uint)(ushort)UVar3 + (uint)(ushort)pUVar10[-2] * 0x400 + -0x35fdc00;
          pUVar15 = this->normTrie;
          if (iVar9 < pUVar15->highStart) {
            iVar9 = ucptrie_internalSmallIndex_63(pUVar15,iVar9);
            pUVar15 = this->normTrie;
          }
          else {
            iVar9 = pUVar15->dataLength + -2;
          }
        }
      }
      else {
        pUVar15 = this->normTrie;
        iVar9 = ((ushort)UVar3 & 0x3f) + (uint)pUVar15->index[(ushort)UVar3 >> 6];
      }
      UVar6 = norm16HasCompBoundaryAfter
                        (this,*(uint16_t *)((long)(pUVar15->data).ptr0 + (long)iVar9 * 2),
                         onlyContiguous);
      if (UVar6 == '\0') {
        pUVar10 = pUVar13;
      }
    }
    if (((doCompose != '\0') && (pUVar14 != pUVar10)) &&
       (UVar6 = ReorderingBuffer::appendZeroCC(buffer,pUVar14,pUVar10,errorCode), UVar6 == '\0'))
    goto LAB_00179dfb;
    pUVar14 = buffer->limit;
    pUVar13 = buffer->start;
    decomposeShort(this,pUVar10,src_00,'\0',onlyContiguous,buffer,errorCode);
    src_00 = decomposeShort(this,src_00,limit,'\x01',onlyContiguous,buffer,errorCode);
    pRVar12 = (ReorderingBuffer *)0x1;
    if (U_ZERO_ERROR < *errorCode) goto LAB_00179d73;
    if (0xfffffffe < (long)src_00 - (long)pUVar10) {
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      goto LAB_00179d73;
    }
    recompose(this,buffer,(int32_t)((ulong)((long)pUVar14 - (long)pUVar13) >> 1),onlyContiguous);
    src = src_00;
    if (doCompose == '\0') {
      UVar6 = ReorderingBuffer::equals(buffer,pUVar10,src_00);
      if (UVar6 == '\0') goto LAB_00179df4;
      ReorderingBuffer::remove(buffer,(char *)pUVar10);
    }
    goto LAB_00179590;
  }
  if ((norm16 < this->minNoNoEmpty) ||
     ((UVar6 = hasCompBoundaryBefore(this,src_00,limit), UVar6 == '\0' &&
      (UVar6 = hasCompBoundaryAfter(this,pUVar14,pUVar10,onlyContiguous), UVar6 == '\0'))))
  goto LAB_001798f4;
  if (pUVar14 == pUVar10) goto LAB_00179590;
  cVar7 = ReorderingBuffer::appendZeroCC(buffer,pUVar14,pUVar10,errorCode);
LAB_00179864:
  pRVar12 = (ReorderingBuffer *)0x1;
  if (cVar7 != '\0') goto LAB_00179590;
LAB_00179d73:
  return (UBool)pRVar12;
}

Assistant:

UBool
Normalizer2Impl::compose(const UChar *src, const UChar *limit,
                         UBool onlyContiguous,
                         UBool doCompose,
                         ReorderingBuffer &buffer,
                         UErrorCode &errorCode) const {
    const UChar *prevBoundary=src;
    UChar32 minNoMaybeCP=minCompNoMaybeCP;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minNoMaybeCP,
                                           doCompose ? &buffer : NULL,
                                           errorCode);
        if(U_FAILURE(errorCode)) {
            return FALSE;
        }
        limit=u_strchr(src, 0);
        if (prevBoundary != src) {
            if (hasCompBoundaryAfter(*(src-1), onlyContiguous)) {
                prevBoundary = src;
            } else {
                buffer.removeSuffix(1);
                prevBoundary = --src;
            }
        }
    }

    for (;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const UChar *prevSrc;
        UChar32 c = 0;
        uint16_t norm16 = 0;
        for (;;) {
            if (src == limit) {
                if (prevBoundary != limit && doCompose) {
                    buffer.appendZeroCC(prevBoundary, limit, errorCode);
                }
                return TRUE;
            }
            if( (c=*src)<minNoMaybeCP ||
                isCompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else {
                prevSrc = src++;
                if(!U16_IS_LEAD(c)) {
                    break;
                } else {
                    UChar c2;
                    if(src!=limit && U16_IS_TRAIL(c2=*src)) {
                        ++src;
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                        norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                        if(!isCompYesAndZeroCC(norm16)) {
                            break;
                        }
                    }
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        // Medium-fast path: Handle cases that do not require full decomposition and recomposition.
        if (!isMaybeOrNonZeroCC(norm16)) {  // minNoNo <= norm16 < minMaybeYes
            if (!doCompose) {
                return FALSE;
            }
            // Fast path for mapping a character that is immediately surrounded by boundaries.
            // In this case, we need not decompose around the current character.
            if (isDecompNoAlgorithmic(norm16)) {
                // Maps to a single isCompYesAndZeroCC character
                // which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    if(!buffer.append(mapAlgorithmic(c, norm16), 0, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 < minNoNoCompBoundaryBefore) {
                // The mapping is comp-normalized which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    const UChar *mapping = reinterpret_cast<const UChar *>(getMapping(norm16));
                    int32_t length = *mapping++ & MAPPING_LENGTH_MASK;
                    if(!buffer.appendZeroCC(mapping, mapping + length, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 >= minNoNoEmpty) {
                // The current character maps to nothing.
                // Simply omit it from the output if there is a boundary before _or_ after it.
                // The character itself implies no boundaries.
                if (hasCompBoundaryBefore(src, limit) ||
                        hasCompBoundaryAfter(prevBoundary, prevSrc, onlyContiguous)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            }
            // Other "noNo" type, or need to examine more text around this character:
            // Fall through to the slow path.
        } else if (isJamoVT(norm16) && prevBoundary != prevSrc) {
            UChar prev=*(prevSrc-1);
            if(c<Hangul::JAMO_T_BASE) {
                // The current character is a Jamo Vowel,
                // compose with previous Jamo L and following Jamo T.
                UChar l = (UChar)(prev-Hangul::JAMO_L_BASE);
                if(l<Hangul::JAMO_L_COUNT) {
                    if (!doCompose) {
                        return FALSE;
                    }
                    int32_t t;
                    if (src != limit &&
                            0 < (t = ((int32_t)*src - Hangul::JAMO_T_BASE)) &&
                            t < Hangul::JAMO_T_COUNT) {
                        // The next character is a Jamo T.
                        ++src;
                    } else if (hasCompBoundaryBefore(src, limit)) {
                        // No Jamo T follows, not even via decomposition.
                        t = 0;
                    } else {
                        t = -1;
                    }
                    if (t >= 0) {
                        UChar32 syllable = Hangul::HANGUL_BASE +
                            (l*Hangul::JAMO_V_COUNT + (c-Hangul::JAMO_V_BASE)) *
                            Hangul::JAMO_T_COUNT + t;
                        --prevSrc;  // Replace the Jamo L as well.
                        if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                            break;
                        }
                        if(!buffer.appendBMP((UChar)syllable, 0, errorCode)) {
                            break;
                        }
                        prevBoundary = src;
                        continue;
                    }
                    // If we see L+V+x where x!=T then we drop to the slow path,
                    // decompose and recompose.
                    // This is to deal with NFKC finding normal L and V but a
                    // compatibility variant of a T.
                    // We need to either fully compose that combination here
                    // (which would complicate the code and may not work with strange custom data)
                    // or use the slow path.
                }
            } else if (Hangul::isHangulLV(prev)) {
                // The current character is a Jamo Trailing consonant,
                // compose with previous Hangul LV that does not contain a Jamo T.
                if (!doCompose) {
                    return FALSE;
                }
                UChar32 syllable = prev + c - Hangul::JAMO_T_BASE;
                --prevSrc;  // Replace the Hangul LV as well.
                if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                    break;
                }
                if(!buffer.appendBMP((UChar)syllable, 0, errorCode)) {
                    break;
                }
                prevBoundary = src;
                continue;
            }
            // No matching context, or may need to decompose surrounding text first:
            // Fall through to the slow path.
        } else if (norm16 > JAMO_VT) {  // norm16 >= MIN_YES_YES_WITH_CC
            // One or more combining marks that do not combine-back:
            // Check for canonical order, copy unchanged if ok and
            // if followed by a character with a boundary-before.
            uint8_t cc = getCCFromNormalYesOrMaybe(norm16);  // cc!=0
            if (onlyContiguous /* FCC */ && getPreviousTrailCC(prevBoundary, prevSrc) > cc) {
                // Fails FCD test, need to decompose and contiguously recompose.
                if (!doCompose) {
                    return FALSE;
                }
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const UChar *nextSrc;
                uint16_t n16;
                for (;;) {
                    if (src == limit) {
                        if (doCompose) {
                            buffer.appendZeroCC(prevBoundary, limit, errorCode);
                        }
                        return TRUE;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, c, n16);
                    if (n16 >= MIN_YES_YES_WITH_CC) {
                        cc = getCCFromNormalYesOrMaybe(n16);
                        if (prevCC > cc) {
                            if (!doCompose) {
                                return FALSE;
                            }
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                // If there is a boundary here, then we continue with no change.
                if (norm16HasCompBoundaryBefore(n16)) {
                    if (isCompYesAndZeroCC(n16)) {
                        src = nextSrc;
                    }
                    continue;
                }
                // Use the slow path. There is no boundary in [prevSrc, src[.
            }
        }

        // Slow path: Find the nearest boundaries around the current character,
        // decompose and recompose.
        if (prevBoundary != prevSrc && !norm16HasCompBoundaryBefore(norm16)) {
            const UChar *p = prevSrc;
            UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, prevBoundary, p, c, norm16);
            if (!norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
                prevSrc = p;
            }
        }
        if (doCompose && prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
            break;
        }
        int32_t recomposeStartIndex=buffer.length();
        // We know there is not a boundary here.
        decomposeShort(prevSrc, src, FALSE /* !stopAtCompBoundary */, onlyContiguous,
                       buffer, errorCode);
        // Decompose until the next boundary.
        src = decomposeShort(src, limit, TRUE /* stopAtCompBoundary */, onlyContiguous,
                             buffer, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        if ((src - prevSrc) > INT32_MAX) {  // guard before buffer.equals()
            errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return TRUE;
        }
        recompose(buffer, recomposeStartIndex, onlyContiguous);
        if(!doCompose) {
            if(!buffer.equals(prevSrc, src)) {
                return FALSE;
            }
            buffer.remove();
        }
        prevBoundary=src;
    }
    return TRUE;
}